

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

int toknext(tokcxdef *ctx)

{
  char **ppcVar1;
  ushort *puVar2;
  toksdef *ptVar3;
  ushort uVar4;
  ushort *puVar5;
  bool bVar6;
  short sVar7;
  short sVar8;
  long lVar9;
  byte bVar10;
  ushort uVar11;
  int iVar12;
  ulong uVar13;
  ushort **ppuVar14;
  long lVar15;
  __int32_t **pp_Var16;
  tokdfdef *ptVar17;
  ulong uVar18;
  tokscdef *ptVar19;
  char *pcVar20;
  ushort *puVar21;
  byte bVar22;
  char **ppcVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  char *pcVar27;
  toktdef *ptVar28;
  char *pcVar29;
  uint uVar30;
  uint uVar31;
  size_t sVar32;
  bool bVar33;
  char mysym [39];
  char local_58 [40];
  
  uVar24 = ctx->tokcxflg;
  if ((uVar24 & 8) != 0) {
    (ctx->tokcxcur).toktyp = 0x35;
    ctx->tokcxflg = uVar24 & 0xfffffff7;
    return 0x35;
  }
  ppcVar1 = &ctx->tokcxptr;
  pcVar27 = ctx->tokcxptr;
  puVar2 = &ctx->tokcxlen;
  uVar13 = (ulong)ctx->tokcxlen;
LAB_00115ff6:
  pcVar20 = pcVar27;
  uVar18 = uVar13;
  if ((int)uVar13 != 0) goto LAB_00116064;
  lVar15 = (long)ctx->tokcxmlvl;
  if (lVar15 != 0) {
    ctx->tokcxmlvl = ctx->tokcxmlvl + -1;
    puVar21 = ctx->tokcxmsvl + lVar15 + -1;
    ppcVar23 = ctx->tokcxmsav + lVar15 + -1;
LAB_00116053:
    pcVar27 = *ppcVar23;
    uVar13 = 0;
    pcVar20 = pcVar27;
    uVar18 = (ulong)*puVar21;
    if (*puVar21 != 0) {
LAB_00116064:
      iVar12 = (int)uVar18;
      pcVar27 = pcVar20;
      do {
        bVar22 = *pcVar27;
        if (((long)(char)bVar22 < 0) ||
           (ppuVar14 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar14 + (long)(char)bVar22 * 2 + 1) & 0x20) == 0)) {
          if ((1 < (int)uVar18) && (bVar22 == 0x2f)) {
            uVar13 = 0;
            if (pcVar27[1] == 0x2f) goto LAB_00115ff6;
            if (pcVar27[1] == 0x2a) goto LAB_001160d4;
          }
          ppuVar14 = __ctype_b_loc();
          pcVar20 = (ctx->tokcxcur).toknam;
          goto LAB_001161b5;
        }
        pcVar27 = pcVar27 + 1;
        uVar24 = (int)uVar18 - 1;
        uVar18 = (ulong)uVar24;
      } while (uVar24 != 0);
      pcVar27 = pcVar20 + iVar12;
      uVar13 = 0;
    }
    goto LAB_00115ff6;
  }
  iVar12 = tokgetlin(ctx,1);
  puVar21 = puVar2;
  ppcVar23 = ppcVar1;
  if (iVar12 == 0) goto LAB_00116053;
LAB_00116163:
  (ctx->tokcxcur).toktyp = 1;
  sVar32 = 0;
  pcVar29 = pcVar27;
  goto LAB_00116173;
LAB_001160d4:
  uVar24 = (uint)uVar18;
  if ((int)uVar24 < 2) {
    pcVar27 = pcVar27 + (uVar24 != 0);
    uVar18 = (ulong)(uVar24 - 1);
    if (uVar24 < 2) {
      lVar15 = (long)ctx->tokcxmlvl;
      if (lVar15 == 0) {
        iVar12 = tokgetlin(ctx,0);
        if (iVar12 != 0) goto LAB_00116163;
        pcVar27 = *ppcVar1;
        uVar18 = (ulong)*puVar2;
      }
      else {
        ctx->tokcxmlvl = ctx->tokcxmlvl + -1;
        pcVar27 = ctx->tokcxmsav[lVar15 + -1];
        uVar18 = (ulong)ctx->tokcxmsvl[lVar15 + -1];
      }
    }
    goto LAB_001160d4;
  }
  if ((*pcVar27 != 0x2a) || (pcVar27[1] != 0x2f)) {
    uVar18 = (ulong)(uVar24 - 1);
    pcVar27 = pcVar27 + 1;
    goto LAB_001160d4;
  }
  pcVar27 = pcVar27 + 2;
  uVar13 = (ulong)(uVar24 - 2);
  goto LAB_00115ff6;
LAB_001161b5:
  puVar5 = *ppuVar14;
  bVar22 = *pcVar27;
  uVar24 = (uint)uVar18;
  if ((((puVar5[bVar22] >> 10 & 1) != 0) || (bVar22 == 0x5f)) || (bVar22 == 0x24)) {
    sVar32 = 0;
    if (uVar24 == 0) {
      uVar30 = 0;
      pcVar29 = pcVar20;
    }
    else {
      lVar15 = 0;
      uVar30 = 0;
      do {
        bVar22 = pcVar27[lVar15];
        uVar25 = (uint)lVar15;
        if ((((bVar22 != 0x5f) && (((*ppuVar14)[bVar22] & 0xc00) == 0)) && (bVar22 != 0x24)) ||
           (0x26 < uVar25)) {
          pcVar20[lVar15] = '\0';
          pcVar29 = pcVar27 + lVar15;
          bVar22 = pcVar27[lVar15];
          sVar32 = (uVar18 & 0xffffffff) - lVar15;
          if (((((*ppuVar14)[bVar22] & 0xc00) == 0) && (bVar22 != 0x24)) && (bVar22 != 0x5f))
          goto LAB_0011630b;
          goto LAB_00116297;
        }
        if ((((*ppuVar14)[bVar22] >> 8 & 1) != 0) && ((ctx->tokcxflg & 2) != 0)) {
          pp_Var16 = __ctype_tolower_loc();
          bVar22 = *(byte *)(*pp_Var16 + bVar22);
        }
        uVar30 = (uint)(byte)((char)uVar30 + bVar22);
        pcVar20[lVar15] = bVar22;
        lVar15 = lVar15 + 1;
      } while (uVar24 != (uint)lVar15);
      pcVar27 = pcVar27 + lVar15;
      pcVar29 = pcVar20 + lVar15;
    }
    *pcVar29 = '\0';
    pcVar29 = pcVar27;
    uVar25 = uVar24;
    goto LAB_0011630b;
  }
  if ((puVar5[bVar22] >> 0xb & 1) != 0) {
    if (bVar22 == 0x30) {
      pcVar29 = pcVar27 + 1;
      uVar25 = uVar24 - 1;
      if (uVar25 != 0) {
        if ((byte)(*pcVar29 | 0x20U) != 0x78) {
          lVar9 = (ulong)(uVar24 - 2) + 2;
          lVar15 = 0;
          goto LAB_00116ac0;
        }
        pcVar29 = pcVar27 + 2;
        uVar25 = uVar24 - 2;
        if (uVar25 != 0) {
          lVar9 = (ulong)(uVar24 - 3) + 3;
          lVar15 = 0;
          goto LAB_0011663f;
        }
      }
    }
    else {
      pcVar29 = pcVar27;
      if (uVar24 != 0) {
        pcVar20 = pcVar27 + (ulong)(uVar24 - 1) + 1;
        lVar15 = 0;
        goto LAB_001169de;
      }
    }
    uVar25 = 0;
    lVar15 = 0;
    goto LAB_00116af7;
  }
  if ((bVar22 == 0x27) || (bVar22 == 0x22)) {
    pcVar29 = pcVar27 + 1;
    bVar33 = bVar22 == 0x22;
    if ((bVar33) && (2 < (int)uVar24)) {
      iVar12 = 0x35;
      bVar22 = 0x22;
      bVar33 = true;
      if ((*pcVar29 == 0x3c) && (pcVar27[2] == 0x3c)) {
        if (0x13 < (long)ctx->tokcxmlvl) goto LAB_00116b24;
        ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar27 + 3;
        ctx->tokcxmsvl[ctx->tokcxmlvl] = (short)uVar18 - 3;
        ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
        pcVar27 = tokmac1s;
        uVar18 = strlen(tokmac1s);
        *(byte *)&ctx->tokcxflg = (byte)ctx->tokcxflg | 1;
        goto LAB_001161b5;
      }
    }
    else {
      iVar12 = (bVar22 != 0x22) + 0x35;
    }
    (ctx->tokcxcur).toktyp = iVar12;
    uVar11 = (*ctx->tokcxsst)(ctx->tokcxscx);
    (ctx->tokcxcur).tokofs = uVar11;
    bVar6 = false;
    sVar32 = (size_t)(uVar24 - 1);
    pcVar27 = pcVar29;
    goto LAB_00116723;
  }
  if ((((int)uVar24 < 2) || (bVar22 != 0x3e)) ||
     ((pcVar27[1] != 0x3e || ((ctx->tokcxflg & 1U) == 0)))) {
    ptVar19 = ctx->tokcxsc[ctx->tokcxinx[bVar22]];
    while( true ) {
      if (ptVar19 == (tokscdef *)0x0) {
        errsigf(ctx->tokcxerr,"TADS",100);
      }
      iVar12 = ptVar19->toksclen;
      if ((iVar12 <= (int)uVar24) &&
         ((iVar12 == 1 ||
          ((ptVar19->tokscstr[1] == pcVar27[1] &&
           ((iVar12 == 2 || (ptVar19->tokscstr[2] == pcVar27[2])))))))) break;
      ptVar19 = ptVar19->tokscnxt;
    }
    (ctx->tokcxcur).toktyp = ptVar19->toksctyp;
    pcVar29 = pcVar27 + ptVar19->toksclen;
    uVar25 = uVar24 - ptVar19->toksclen;
    goto LAB_00116b08;
  }
  ctx->tokcxflg = ctx->tokcxflg & 0xfffffffe;
  if ((long)ctx->tokcxmlvl < 0x14) {
    ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar27 + 2;
    ctx->tokcxmsvl[ctx->tokcxmlvl] = (short)uVar18 - 2;
    iVar12 = ctx->tokcxmlvl;
    ctx->tokcxmlvl = iVar12 + 1;
    if (pcVar27[2] == 0x22) {
      ctx->tokcxmsav[iVar12] = ctx->tokcxmsav[iVar12] + 1;
      ctx->tokcxmsvl[(long)ctx->tokcxmlvl + -1] = ctx->tokcxmsvl[(long)ctx->tokcxmlvl + -1] - 1;
      uVar24 = ctx->tokcxflg & 0xffffffef;
      pcVar27 = tokmac3;
    }
    else {
      uVar24 = ctx->tokcxflg | 0x10;
      pcVar27 = tokmac2;
    }
    ctx->tokcxflg = uVar24;
    uVar18 = strlen(pcVar27);
    goto LAB_001161b5;
  }
  goto LAB_00116b24;
  while( true ) {
    pcVar29 = pcVar29 + 1;
    uVar31 = (int)sVar32 - 1;
    sVar32 = (size_t)uVar31;
    if (uVar31 == 0) break;
LAB_00116297:
    bVar22 = *pcVar29;
    if (((((*ppuVar14)[bVar22] & 0xc00) == 0) && (bVar22 != 0x5f)) && (bVar22 != 0x24))
    goto LAB_001162c0;
  }
  sVar32 = 0;
  pcVar29 = pcVar27 + (ulong)(uVar24 - 1) + 1;
LAB_001162c0:
  pcVar27 = errstr(ctx->tokcxerr,pcVar20,(ctx->tokcxcur).toklen);
  ctx->tokcxerr->errcxptr->erraav[0].errastr = pcVar27;
  ctx->tokcxerr->errcxptr->erraac = 1;
  errlogn(ctx->tokcxerr,0x66,"TADS");
LAB_0011630b:
  iVar12 = (int)sVar32;
  (ctx->tokcxcur).toklen = uVar25;
  (ctx->tokcxcur).tokhash = uVar30;
  if (uVar25 == 9) {
    pcVar27 = "__defined";
    if ((ctx->tokcxflg & 2U) == 0) {
      pcVar27 = "__DEFINED";
    }
    if (((2 < iVar12) &&
        ((ctx->tokcxcur).toknam[8] == (char)*(long *)((long)pcVar27 + 8) &&
         *(long *)(ctx->tokcxcur).toknam == *(long *)pcVar27)) && (*pcVar29 == 0x28)) {
      bVar22 = pcVar29[1];
      uVar4 = (*ppuVar14)[bVar22];
      if (((((uVar4 & 0xc00) != 0) || (bVar22 == 0x5f)) || (bVar22 == 0x24)) &&
         ((uVar4 >> 0xb & 1) == 0)) {
        bVar22 = pcVar29[1];
        lVar15 = 0;
        pcVar27 = pcVar29;
        if (bVar22 != 0x29) {
          lVar15 = 0;
          do {
            if ((((((*ppuVar14)[bVar22] & 0xc00) == 0) && (bVar22 != 0x5f)) && (bVar22 != 0x24)) ||
               (iVar12 + -2 == (int)lVar15)) {
              errsigf(ctx->tokcxerr,"TADS",0x79);
            }
            bVar22 = pcVar29[lVar15 + 2];
            lVar15 = lVar15 + 1;
          } while (bVar22 != 0x29);
          iVar12 = iVar12 - (int)lVar15;
          pcVar27 = pcVar29 + lVar15;
        }
        sVar32 = (size_t)(iVar12 - 2);
        pcVar20 = tok_casefold_defsym((tokcxdef *)(ulong)(uint)ctx->tokcxflg,local_58,pcVar29 + 1,
                                      (int)lVar15);
        (ctx->tokcxcur).toktyp = 0x37;
        ptVar17 = tok_find_define(ctx,pcVar20,(int)lVar15);
        (ctx->tokcxcur).tokval = (ulong)(ptVar17 != (tokdfdef *)0x0);
        pcVar29 = pcVar27 + 2;
        goto LAB_00116173;
      }
    }
  }
  ptVar17 = tok_find_define(ctx,pcVar20,uVar25);
  if (ptVar17 == (tokdfdef *)0x0) {
    ptVar28 = ctx->tokcxstab;
    if (ptVar28 == (toktdef *)0x0) goto LAB_001165c5;
    ptVar3 = &(ctx->tokcxcur).toksym;
    goto LAB_001165a0;
  }
  if (0x13 < (long)ctx->tokcxmlvl) goto LAB_00116b24;
  ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar29;
  ctx->tokcxmsvl[ctx->tokcxmlvl] = (ushort)sVar32;
  ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
  pcVar27 = ptVar17->expan;
  uVar18 = (ulong)(uint)ptVar17->explen;
  goto LAB_001161b5;
  while (ptVar28 = ptVar28->toktnxt, ptVar28 != (toktdef *)0x0) {
LAB_001165a0:
    iVar12 = (*ptVar28->toktfsea)(ptVar28,pcVar20,uVar25,uVar30,ptVar3);
    if (iVar12 != 0) {
      if (ptVar3->tokstyp == '\v') {
        (ctx->tokcxcur).toktyp = (uint)(ctx->tokcxcur).toksym.toksval;
      }
      else {
        (ctx->tokcxcur).toktyp = 0x38;
      }
      goto LAB_00116173;
    }
  }
LAB_001165c5:
  (ctx->tokcxcur).toktyp = 0x38;
  (ctx->tokcxcur).toksym.tokstyp = '\0';
  goto LAB_00116173;
  while( true ) {
    lVar15 = (long)*pcVar27 + lVar15 * 10 + -0x30;
    pcVar27 = pcVar27 + 1;
    uVar18 = (ulong)(uVar25 - 1);
    if (uVar25 - 1 == 0) break;
LAB_001169de:
    uVar25 = (uint)uVar18;
    pcVar29 = pcVar27;
    if ((*(byte *)((long)puVar5 + (ulong)(byte)*pcVar27 * 2 + 1) & 8) == 0) goto LAB_00116af7;
  }
  uVar25 = 0;
  pcVar29 = pcVar20;
  goto LAB_00116af7;
  while( true ) {
    lVar15 = (long)(char)bVar22 + lVar15 * 8 + -0x30;
    pcVar29 = pcVar29 + 1;
    uVar25 = uVar25 - 1;
    if (uVar25 == 0) break;
LAB_00116ac0:
    bVar22 = *pcVar29;
    if ((0xfd < (byte)(bVar22 - 0x3a)) || ((puVar5[bVar22] & 0x800) == 0)) goto LAB_00116af7;
  }
  goto LAB_00116aee;
LAB_00116723:
  iVar12 = (int)sVar32;
  sVar7 = (short)pcVar27;
  sVar8 = (short)pcVar29;
  if (1 < iVar12) {
    bVar10 = *pcVar27;
    if (bVar10 == 0x5c) {
      if ((pcVar27[1] == 0x27) || (pcVar27[1] == 0x22)) {
        (*ctx->tokcxsad)(ctx->tokcxscx,pcVar29,sVar7 - sVar8);
        pcVar29 = pcVar27 + 1;
      }
      sVar32 = (size_t)(iVar12 - 2);
      pcVar27 = pcVar27 + 2;
    }
    else {
LAB_00116778:
      if ((bVar10 == bVar22) ||
         ((((bVar10 == 0x3c && bVar33 && (1 < iVar12)) && (pcVar27[1] == 0x3c)) &&
          ((ctx->tokcxflg & 1) == 0)))) goto LAB_001168b2;
      sVar32 = (size_t)(iVar12 - 1);
      pcVar27 = pcVar27 + 1;
    }
    goto LAB_00116723;
  }
  if (iVar12 != 0) {
    bVar10 = *pcVar27;
    goto LAB_00116778;
  }
  (*ctx->tokcxsad)(ctx->tokcxscx,pcVar29,sVar7 - sVar8);
  lVar15 = (long)ctx->tokcxmlvl;
  if (lVar15 == 0) {
    (*ctx->tokcxsad)(ctx->tokcxscx," ",1);
    goto LAB_001167f9;
  }
  ctx->tokcxmlvl = ctx->tokcxmlvl + -1;
  sVar32 = (size_t)ctx->tokcxmsvl[lVar15 + -1];
  pcVar29 = ctx->tokcxmsav[lVar15 + -1];
LAB_001168a1:
  pcVar27 = pcVar29;
  if ((int)sVar32 == 0) {
LAB_001167f9:
    iVar12 = tokgetlin(ctx,0);
    if (iVar12 != 0) {
      errsigf(ctx->tokcxerr,"TADS",0x65);
    }
    pcVar29 = *ppcVar1;
    uVar4 = *puVar2;
    sVar32 = (size_t)uVar4;
    if (uVar4 == 0 || bVar6) {
      if (uVar4 != 0) goto LAB_00116870;
      sVar32 = 0;
    }
    else {
      if ((*pcVar29 == 0x7d) || (bVar6 = false, *pcVar29 == 0x3b)) {
        errlogf(ctx->tokcxerr,"TADS",0x159);
        bVar6 = true;
      }
LAB_00116870:
      pcVar27 = pcVar29 + (ulong)(uVar4 - 1) + 1;
      do {
        if (((long)*pcVar29 < 0) ||
           ((*(byte *)((long)*ppuVar14 + (long)*pcVar29 * 2 + 1) & 0x20) == 0)) goto LAB_001168a1;
        pcVar29 = pcVar29 + 1;
        uVar24 = (int)sVar32 - 1;
        sVar32 = (size_t)uVar24;
      } while (uVar24 != 0);
      sVar32 = 0;
      pcVar29 = pcVar27;
    }
    goto LAB_001168a1;
  }
  goto LAB_00116723;
LAB_001168b2:
  (*ctx->tokcxsad)(ctx->tokcxscx,pcVar29,sVar7 - sVar8);
  (*ctx->tokcxsend)(ctx->tokcxscx);
  if (*pcVar27 == bVar22) {
    sVar32 = (size_t)(iVar12 - 1U);
    pcVar29 = pcVar27 + 1;
    if ((ctx->tokcxflg & 0x11U) == 0x10) {
      ctx->tokcxflg = ctx->tokcxflg & 0xffffffee;
      if (0x13 < (long)ctx->tokcxmlvl) {
LAB_00116b24:
        errsigf(ctx->tokcxerr,"TADS",0x78);
      }
      ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar27 + 1;
      ctx->tokcxmsvl[ctx->tokcxmlvl] = (ushort)(iVar12 - 1U);
      ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
      sVar32 = strlen(tokmac4);
      pcVar29 = tokmac4;
    }
  }
  else {
    pcVar29 = pcVar27;
    if (*pcVar27 == 0x3c) {
      if (0x13 < (long)ctx->tokcxmlvl) goto LAB_00116b24;
      ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar27 + 2;
      ctx->tokcxmsvl[ctx->tokcxmlvl] = (short)sVar32 - 2;
      ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
      sVar32 = strlen(tokmac1);
      uVar24 = ctx->tokcxflg;
      ctx->tokcxflg = uVar24 | 1;
      pcVar29 = tokmac1;
      if ((uVar24 & 0x10) == 0) {
        ctx->tokcxflg = uVar24 | 9;
        (ctx->tokcxcur).toktyp = 0x32;
      }
    }
  }
  goto LAB_00116173;
LAB_0011663f:
  do {
    bVar22 = *pcVar29;
    uVar13 = (ulong)bVar22;
    if ((*(byte *)((long)puVar5 + uVar13 * 2 + 1) & 8) == 0) {
      if ((byte)(bVar22 + 0x9f) < 6) {
        lVar26 = uVar13 - 0x57;
      }
      else {
        if (5 < (byte)(bVar22 + 0xbf)) goto LAB_00116af7;
        lVar26 = uVar13 - 0x37;
      }
    }
    else {
      lVar26 = (long)(char)bVar22 + -0x30;
    }
    lVar15 = lVar15 * 0x10 + lVar26;
    pcVar29 = pcVar29 + 1;
    uVar25 = uVar25 - 1;
  } while (uVar25 != 0);
LAB_00116aee:
  uVar25 = 0;
  pcVar29 = pcVar27 + lVar9;
LAB_00116af7:
  (ctx->tokcxcur).tokval = lVar15;
  (ctx->tokcxcur).toktyp = 0x37;
LAB_00116b08:
  sVar32 = (size_t)uVar25;
LAB_00116173:
  ctx->tokcxptr = pcVar29;
  ctx->tokcxlen = (ushort)sVar32;
  return (ctx->tokcxcur).toktyp;
}

Assistant:

int toknext(tokcxdef *ctx)
{
    char   *p;
    tokdef *tok = &ctx->tokcxcur;
    int     len;

    /* 
     *   Check for the special case that we pushed an open paren prior to
     *   a string containing an embedded expression.  If this is the case,
     *   immediately return the string we previously parsed. 
     */
    if ((ctx->tokcxflg & TOKCXF_EMBED_PAREN_PRE) != 0)
    {
        /* 
         *   convert the token to a string - note that the offset
         *   information for the string is already in the current token
         *   structure, since we set everything up for it on the previous
         *   call where we actually parsed the beginning of the string 
         */
        tok->toktyp = TOKTDSTRING;

        /* clear the special flag - we've now consumed the pushed string */
        ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_PRE;

        /* immediately return the string */
        return tok->toktyp;
    }

    /* set up at the current scanning position */
    p = ctx->tokcxptr;
    len = ctx->tokcxlen;

    /* scan off whitespace and comments until we find something */
    do
    {
    skipblanks:
        /* if there's nothing on this line, get the next one */
        if (len == 0)
        {
            /* if we're in a macro expansion, continue after it */
            if (ctx->tokcxmlvl)
            {
                ctx->tokcxmlvl--;
                p = ctx->tokcxmsav[ctx->tokcxmlvl];
                len = ctx->tokcxmsvl[ctx->tokcxmlvl];
            }
            else
            {
                if (tokgetlin(ctx, TRUE))
                {
                    tok->toktyp = TOKTEOF;
                    goto done;
                }
                p = ctx->tokcxptr;
                len = ctx->tokcxlen;
            }
        }
        while (len && t_isspace(*p)) ++p, --len;     /* scan off whitespace */
        
        /* check for comments, and remove if present */
        if (len >= 2 && *p == '/' && *(p+1) == '/')
            len = 0;
        else if (len >= 2 && *p == '/' && *(p+1) == '*')
        {
            while (len < 2 || *p != '*' || *(p+1) != '/')
            {
                if (len != 0)
                    ++p, --len;

                if (len == 0)
                {
                    if (ctx->tokcxmlvl != 0)
                    {
                        ctx->tokcxmlvl--;
                        p = ctx->tokcxmsav[ctx->tokcxmlvl];
                        len = ctx->tokcxmsvl[ctx->tokcxmlvl];
                    }
                    else
                    {
                        if (tokgetlin(ctx, FALSE))
                        {
                            ctx->tokcxptr = p;
                            tok->toktyp = TOKTEOF;
                            goto done;
                        }
                        p = ctx->tokcxptr;
                        len = ctx->tokcxlen;
                    }
                }
            }
            p += 2;
            len -= 2;
            goto skipblanks;
        }
    } while (len == 0);
    
nexttoken:
    if (isalpha((uchar)*p) || *p == '_' || *p == '$')
    {
        int       l;
        int       hash;
        char     *q;
        toktdef  *tab;
        int       found = FALSE;
        uchar     thischar;
        tokdfdef *df;
        
        for (hash = 0, l = 0, q = tok->toknam ;
             len != 0 && TOKISSYM(*p) && l < TOKNAMMAX ;
             (thischar = ((isupper((uchar)*p)
                           && (ctx->tokcxflg & TOKCXCASEFOLD))
                          ? tolower((uchar)*p) : *p)),
             (hash = ((hash + thischar) & (TOKHASHSIZE - 1))),
             (*q++ = thischar), ++p, --len, ++l) ;
        *q = '\0';
        if (len != 0 && TOKISSYM(*p))
        {
            while (len != 0 && TOKISSYM(*p)) ++p, --len;
            errlog1(ctx->tokcxerr, ERR_TRUNC, ERRTSTR,
                    errstr(ctx->tokcxerr, tok->toknam, tok->toklen));
        }
        tok->toklen = l;
        tok->tokhash = hash;

        /*
         *   check for the special defined() preprocessor operator 
         */
        if (l == 9 && !memcmp(tok->toknam,
                              ((ctx->tokcxflg & TOKCXCASEFOLD)
                               ? "__defined" : "__DEFINED"),
                              (size_t)9)
            && len > 2 && *p == '(' && TOKISSYM(*(p+1))
            && !isdigit((uchar)*(p+1)))
        {
            int symlen;
            char mysym[TOKNAMMAX];
            
            /* find the matching ')', allowing only symbolic characters */
            ++p, --len;
            for (symlen = 0, q = p ; len && *p != ')' && TOKISSYM(*p) ;
                 ++p, --len, ++symlen) ;

            /* make sure we found the closing paren */
            if (!len || *p != ')')
                errsig(ctx->tokcxerr, ERR_BADISDEF);
            ++p, --len;

            /* if we're folding case, convert the symbol to lower case */
            q = tok_casefold_defsym(ctx, mysym, q, symlen);

            /* check to see if it's defined */
            tok->toktyp = TOKTNUMBER;
            tok->tokval = (tok_find_define(ctx, q, symlen) != 0);
            goto done;
        }

        /* substitute the preprocessor #define, if any */
        if ((df = tok_find_define(ctx, tok->toknam, l)) != 0)
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
            ctx->tokcxmlvl++;

            /* point to the token's expansion and keep going */
            p = df->expan;
            len = df->explen;
            goto nexttoken;
        }
        
        /* look up in symbol table(s), if any */
        for (tab = ctx->tokcxstab ; tab ; tab = tab->toktnxt)
        {
            if ((found = (*tab->toktfsea)(tab, tok->toknam, l, hash,
                                          &tok->toksym)) != 0)
                break;
        }
        
        if (found && tok->toksym.tokstyp == TOKSTKW)
            tok->toktyp = tok->toksym.toksval;
        else
        {
            tok->toktyp = TOKTSYMBOL;
            if (!found) tok->toksym.tokstyp = TOKSTUNK;
        }
        goto done;
    }
    else if (isdigit((uchar)*p))
    {
        long acc = 0;
        
        /* check for octal/hex */
        if (*p == '0')
        {
            ++p, --len;
            if (len && (*p == 'x' || *p == 'X'))
            {
                /* hex */
                ++p, --len;
                while (len && TOKISHEX(*p))
                {
                    acc = (acc << 4) + TOKHEX2INT(*p);
                    ++p, --len;
                }
            }
            else
            {
                /* octal */
                while (len && TOKISOCT(*p))
                {
                    acc = (acc << 3) + TOKOCT2INT(*p);
                    ++p, --len;
                }
            }
        }
        else
        {
            /* decimal */
            while (len && isdigit((uchar)*p))
            {
                acc = (acc << 1) + (acc << 3) + TOKDEC2INT(*p);
                ++p, --len;
            }
        }
        tok->tokval = acc;
        tok->toktyp = TOKTNUMBER;
        goto done;
    }
    else if (*p == '"' || *p == '\'')
    {
        char  delim;                 /* closing delimiter we're looking for */
        char *strstart;                       /* pointer to start of string */
        int   warned;
        
        delim = *p;
        --len;
        strstart = ++p;

        if (delim == '"' && len >= 2 && *p == '<' && *(p+1) == '<')
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p + 2;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len - 2;
            ctx->tokcxmlvl++;

            /* 
             *   read from the special "<<" expansion string - use the
             *   version for a "<<" at the very beginning of the string 
             */
            p = tokmac1s;
            len = strlen(p);
            ctx->tokcxflg |= TOKCXFINMAC;
            goto nexttoken;
        }
        tok->toktyp = (delim == '"' ? TOKTDSTRING : TOKTSSTRING);
        
        tok->tokofs = (*ctx->tokcxsst)(ctx->tokcxscx);  /* start the string */
        for (warned = FALSE ;; )
        {
            if (len >= 2 && *p == '\\')
            {
                if (*(p+1) == '"' || *(p+1) == '\'')
                {
                    (*ctx->tokcxsad)(ctx->tokcxscx, strstart,
                                     (ushort)(p - strstart));
                    strstart = p + 1;
                }
                p += 2;
                len -= 2;
            }
            else if (len == 0 || *p == delim ||
                     (delim == '"' && len >= 2 && *p == '<' && *(p+1) == '<'
                      && !(ctx->tokcxflg & TOKCXFINMAC)))
            {
                (*ctx->tokcxsad)(ctx->tokcxscx, strstart,
                                 (ushort)(p - strstart));
                if (len == 0)
                {
                    if (ctx->tokcxmlvl)
                    {
                        ctx->tokcxmlvl--;
                        p = ctx->tokcxmsav[ctx->tokcxmlvl];
                        len = ctx->tokcxmsvl[ctx->tokcxmlvl];
                    }
                    else
                        (*ctx->tokcxsad)(ctx->tokcxscx, " ", (ushort)1);
                    
                    while (len == 0)
                    {
                        if (tokgetlin(ctx, FALSE))
                            errsig(ctx->tokcxerr, ERR_STREOF);
                        p = ctx->tokcxptr;
                        len = ctx->tokcxlen;

                        /* warn if it looks like the end of an object */
                        if (!warned && len && (*p == ';' || *p == '}'))
                        {
                            errlog(ctx->tokcxerr, ERR_STREND);
                            warned = TRUE;     /* warn only once per string */
                        }

                        /* scan past whitespace at start of line */
                        while (len && t_isspace(*p)) ++p, --len;
                    }
                    strstart = p;
                }
                else break;
            }
            else
                ++p, --len;
        }

        /* end the string */
        (*ctx->tokcxsend)(ctx->tokcxscx);

        /* check to see how it ended */
        if (len != 0 && *p == delim)
        {
            /* 
             *   We ended with the matching delimiter.  Move past the
             *   closing delimiter. 
             */
            ++p;
            --len;

            /*
             *   If we have a pending close paren we need to put in
             *   because of an embedded expression that occurred earlier
             *   in the string, parse the macro to provide the paren.  
             */
            if ((ctx->tokcxflg & TOKCXF_EMBED_PAREN_AFT) != 0
                && !(ctx->tokcxflg & TOKCXFINMAC))
            {
                /* clear the flag */
                ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_AFT;

                /* push the current parsing position */
                if (ctx->tokcxmlvl >= TOKMACNEST)
                    errsig(ctx->tokcxerr, ERR_MACNEST);
                ctx->tokcxmsav[ctx->tokcxmlvl] = p;
                ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
                ctx->tokcxmlvl++;

                /* parse the macro */
                p = tokmac4;
                len = strlen(p);
            }
        }
        else if (len != 0 && *p == '<')
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p + 2;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len - 2;
            ctx->tokcxmlvl++;

            /* read from the "<<" expansion */
            p = tokmac1;
            len = strlen(p);
            ctx->tokcxflg |= TOKCXFINMAC;

            /* 
             *   Set the special push-a-paren flag: we'll return an open
             *   paren now, so that we have an open paren before the
             *   string, and then on the next call to toknext() we'll
             *   immediately return the string we've already parsed here.
             *   This will ensure that everything in the string is
             *   properly grouped together as a single indivisible
             *   expression.
             *   
             *   Note that we only need to do this for the first embedded
             *   expression in a string.  Once we have a close paren
             *   pending, we don't need more open parens.  
             */
            if (!(ctx->tokcxflg & TOKCXF_EMBED_PAREN_AFT))
            {
                ctx->tokcxflg |= TOKCXF_EMBED_PAREN_PRE;
                tok->toktyp = TOKTLPAR;
            }
        }
        goto done;
    }
    else if (len >= 2 && *p == '>' && *(p+1) == '>'
             && (ctx->tokcxflg & TOKCXFINMAC) != 0)
    {
        /* skip the ">>" */
        ctx->tokcxflg &= ~TOKCXFINMAC;
        p += 2;
        len -= 2;

        /* save the current parsing position */
        if (ctx->tokcxmlvl >= TOKMACNEST)
            errsig(ctx->tokcxerr, ERR_MACNEST);
        ctx->tokcxmsav[ctx->tokcxmlvl] = p;
        ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
        ctx->tokcxmlvl++;

        if (*p == '"')
        {
            ++(ctx->tokcxmsav[ctx->tokcxmlvl - 1]);
            --(ctx->tokcxmsvl[ctx->tokcxmlvl - 1]);
            p = tokmac3;

            /* 
             *   we won't need an extra closing paren now, since tokmac3
             *   provides it 
             */
            ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_AFT;
        }
        else
        {
            /* 
             *   The string is continuing.  Set a flag to note that we
             *   need to provide a close paren after the end of the
             *   string, and parse the glue (tokmac2) that goes between
             *   the expression and the resumption of the string. 
             */
            ctx->tokcxflg |= TOKCXF_EMBED_PAREN_AFT;
            p = tokmac2;
        }

        len = strlen(p);
        goto nexttoken;
    }
    else
    {
        tokscdef *sc;
        
        for (sc = ctx->tokcxsc[ctx->tokcxinx[(uchar)*p]] ; sc ;
             sc = sc->tokscnxt)
        {
            if (toksceq(sc->tokscstr, p, sc->toksclen, len))
            {
                tok->toktyp = sc->toksctyp;
                p += sc->toksclen;
                len -= sc->toksclen;
                goto done;
            }
        }
        errsig(ctx->tokcxerr, ERR_INVTOK);
    }
    
done:
    ctx->tokcxptr = p;
    ctx->tokcxlen = len;
    return(tok->toktyp);
}